

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O0

size_t __thiscall ON_SubDHeap::SizeOfUnusedMeshFragments(ON_SubDHeap *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ON_FixedSizePoolElement *local_40;
  ON_FixedSizePoolElement *e;
  size_t sizeof_fragment;
  size_t i;
  size_t count1;
  size_t count0;
  size_t sz;
  ON_SubDHeap *this_local;
  
  sVar1 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_full_fragments);
  sVar2 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_part_fragments);
  sVar3 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_oddball_fragments);
  sVar4 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_limit_curves);
  count0 = sVar1 + sVar2 + sVar3 + sVar4;
  for (sizeof_fragment = 0; sizeof_fragment < 7; sizeof_fragment = sizeof_fragment + 1) {
    for (local_40 = this->m_unused_fragments[sizeof_fragment];
        local_40 != (ON_FixedSizePoolElement *)0x0; local_40 = local_40->m_next) {
      count0 = g_sizeof_fragment[sizeof_fragment] + count0;
    }
  }
  return count0;
}

Assistant:

size_t SizeOfUnusedMeshFragments() const
  {
    size_t sz 
      = m_fsp_full_fragments.SizeOfUnusedElements()
      + m_fsp_part_fragments.SizeOfUnusedElements()
      + m_fsp_oddball_fragments.SizeOfUnusedElements()
      + m_fsp_limit_curves.SizeOfUnusedElements();

    // It has always been the case that count0 = count1 = ON_SubDDisplayParameters::MaximumDensity + 1.
    // But a wrong answer is better than crashing if somebody incorrectly modifies ON_SubDHeap 
    // in the far future.
    const size_t count0 = sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]);
    const size_t count1 = sizeof(ON_SubDHeap::g_sizeof_fragment) / sizeof(ON_SubDHeap::g_sizeof_fragment[0]);
    for (size_t i = 0; i < count0 && i < count1; ++i)
    {
      const size_t sizeof_fragment = ON_SubDHeap::g_sizeof_fragment[i];
      // The memory for these fragments is managed by m_fsp_full_fragments or m_fsp_part_fragments.
      for (const ON_FixedSizePoolElement* e = m_unused_fragments[i]; nullptr != e; e = e->m_next)
        sz += sizeof_fragment;
    }

    return sz;
  }